

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall Catch::Matchers::HasSizeMatcher::describe_abi_cxx11_(HasSizeMatcher *this)

{
  ReusableStringStream *in_RSI;
  string *in_RDI;
  ReusableStringStream sstr;
  string *this_00;
  
  this_00 = in_RDI;
  ReusableStringStream::ReusableStringStream((ReusableStringStream *)in_RDI);
  ReusableStringStream::operator<<((ReusableStringStream *)this_00,(char (*) [13])in_RDI);
  ReusableStringStream::operator<<((ReusableStringStream *)this_00,(unsigned_long *)in_RDI);
  ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_RDI);
  ReusableStringStream::~ReusableStringStream(in_RSI);
  return this_00;
}

Assistant:

std::string HasSizeMatcher::describe() const {
        ReusableStringStream sstr;
        sstr << "has size == " << m_target_size;
        return sstr.str();
    }